

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,FILE *fp,bool compact)

{
  XMLError XVar1;
  XMLDocument *in_RDI;
  XMLPrinter stream;
  int in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  FILE *in_stack_fffffffffffffeb8;
  XMLPrinter *in_stack_fffffffffffffec0;
  XMLPrinter *in_stack_ffffffffffffffd8;
  XMLDocument *in_stack_ffffffffffffffe0;
  
  SetError(in_RDI,XML_NO_ERROR,(char *)0x0,(char *)0x0);
  XMLPrinter::XMLPrinter
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7,
             in_stack_fffffffffffffeb0);
  Print(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  XVar1 = in_RDI->_errorID;
  XMLPrinter::~XMLPrinter((XMLPrinter *)in_RDI);
  return XVar1;
}

Assistant:

XMLError XMLDocument::SaveFile( FILE* fp, bool compact )
{
    // Clear any error from the last save, otherwise it will get reported
    // for *this* call.
    SetError( XML_NO_ERROR, 0, 0 );
    XMLPrinter stream( fp, compact );
    Print( &stream );
    return _errorID;
}